

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

bool pugi::impl::anon_unknown_0::allow_move(xml_node parent,xml_node child)

{
  bool bVar1;
  xml_node xVar2;
  xml_node xVar3;
  xml_node_type child_00;
  xml_node_struct *in_RSI;
  xml_node_type parent_00;
  xml_node in_RDI;
  xml_node local_30;
  xml_node local_28;
  xml_node local_20;
  
  child_00 = node_null;
  parent_00 = node_null;
  if (in_RDI._root != (xml_node_struct *)0x0) {
    parent_00 = (xml_node_type)(in_RDI._root)->header & (node_doctype|node_declaration);
  }
  if (in_RSI != (xml_node_struct *)0x0) {
    child_00 = (xml_node_type)in_RSI->header & (node_doctype|node_declaration);
  }
  bVar1 = allow_insert_child(parent_00,child_00);
  if (bVar1) {
    xVar2 = xml_node::root(&local_20);
    xVar3 = xml_node::root(&local_28);
    if (xVar2._root == xVar3._root) {
      while( true ) {
        bVar1 = in_RDI._root == (xml_node_struct *)0x0;
        if (bVar1) {
          return bVar1;
        }
        if (in_RDI._root == in_RSI) break;
        local_30._root = in_RDI._root;
        in_RDI = xml_node::parent(&local_30);
      }
      return bVar1;
    }
  }
  return false;
}

Assistant:

PUGI_IMPL_FN bool allow_move(xml_node parent, xml_node child)
	{
		// check that child can be a child of parent
		if (!allow_insert_child(parent.type(), child.type()))
			return false;

		// check that node is not moved between documents
		if (parent.root() != child.root())
			return false;

		// check that new parent is not in the child subtree
		xml_node cur = parent;

		while (cur)
		{
			if (cur == child)
				return false;

			cur = cur.parent();
		}

		return true;
	}